

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

int hdr_calculate_bucket_config
              (int64_t lowest_discernible_value,int64_t highest_trackable_value,
              int significant_figures,hdr_histogram_bucket_config *cfg)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  double dVar8;
  
  iVar5 = 0x16;
  if (lowest_discernible_value * 2 <= highest_trackable_value &&
      (0xfffffffa < significant_figures - 6U && 0 < lowest_discernible_value)) {
    cfg->lowest_discernible_value = lowest_discernible_value;
    uVar2 = (ulong)(uint)significant_figures;
    cfg->significant_figures = uVar2;
    cfg->highest_trackable_value = highest_trackable_value;
    lVar4 = 1;
    while (bVar7 = uVar2 != 0, uVar2 = uVar2 - 1, bVar7) {
      lVar4 = lVar4 * 10;
    }
    dVar8 = log((double)(lVar4 * 2));
    dVar8 = ceil(dVar8 / 0.6931471805599453);
    iVar1 = (int)dVar8;
    iVar6 = 1;
    if (iVar1 < 2) {
      iVar1 = 1;
    }
    cfg->sub_bucket_half_count_magnitude = iVar1 + -1;
    dVar8 = log((double)lowest_discernible_value);
    if (dVar8 / 0.6931471805599453 <= 2147483647.0) {
      cfg->unit_magnitude = (long)(int)(dVar8 / 0.6931471805599453);
      dVar8 = ldexp(1.0,cfg->sub_bucket_half_count_magnitude + 1);
      iVar1 = (int)dVar8;
      cfg->sub_bucket_count = iVar1;
      cfg->sub_bucket_half_count = iVar1 / 2;
      bVar3 = (byte)cfg->unit_magnitude;
      cfg->sub_bucket_mask = (long)iVar1 + -1 << (bVar3 & 0x3f);
      if ((long)cfg->sub_bucket_half_count_magnitude + cfg->unit_magnitude < 0x3e) {
        for (lVar4 = (long)iVar1 << (bVar3 & 0x3f); lVar4 <= highest_trackable_value;
            lVar4 = lVar4 * 2) {
          if (0x3fffffffffffffff < lVar4) {
            iVar6 = iVar6 + 1;
            break;
          }
          iVar6 = iVar6 + 1;
        }
        cfg->bucket_count = iVar6;
        cfg->counts_len = (iVar6 + 1) * (iVar1 / 2);
        iVar5 = 0;
      }
    }
  }
  return iVar5;
}

Assistant:

int hdr_calculate_bucket_config(
    int64_t lowest_discernible_value,
    int64_t highest_trackable_value,
    int significant_figures,
    struct hdr_histogram_bucket_config* cfg)
{
    int32_t sub_bucket_count_magnitude;
    int64_t largest_value_with_single_unit_resolution;

    if (lowest_discernible_value < 1 ||
            significant_figures < 1 || 5 < significant_figures ||
            lowest_discernible_value * 2 > highest_trackable_value)
    {
        return EINVAL;
    }

    cfg->lowest_discernible_value = lowest_discernible_value;
    cfg->significant_figures = significant_figures;
    cfg->highest_trackable_value = highest_trackable_value;

    largest_value_with_single_unit_resolution = 2 * power(10, significant_figures);
    sub_bucket_count_magnitude = (int32_t) ceil(log((double)largest_value_with_single_unit_resolution) / log(2));
    cfg->sub_bucket_half_count_magnitude = ((sub_bucket_count_magnitude > 1) ? sub_bucket_count_magnitude : 1) - 1;

    double unit_magnitude = log((double)lowest_discernible_value) / log(2);
    if (INT32_MAX < unit_magnitude)
    {
        return EINVAL;
    }

    cfg->unit_magnitude = (int32_t) unit_magnitude;
    cfg->sub_bucket_count      = (int32_t) pow(2, (cfg->sub_bucket_half_count_magnitude + 1));
    cfg->sub_bucket_half_count = cfg->sub_bucket_count / 2;
    cfg->sub_bucket_mask       = ((int64_t) cfg->sub_bucket_count - 1) << cfg->unit_magnitude;

    if (cfg->unit_magnitude + cfg->sub_bucket_half_count_magnitude > 61)
    {
        return EINVAL;
    }

    cfg->bucket_count = buckets_needed_to_cover_value(highest_trackable_value, cfg->sub_bucket_count, (int32_t)cfg->unit_magnitude);
    cfg->counts_len = (cfg->bucket_count + 1) * (cfg->sub_bucket_count / 2);

    return 0;
}